

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

void SUNMatDestroy_Dense(SUNMatrix A)

{
  SUNMatrix A_local;
  
  free(*(void **)((long)A->content + 0x10));
  *(undefined8 *)((long)A->content + 0x10) = 0;
  free(*(void **)((long)A->content + 0x20));
  *(undefined8 *)((long)A->content + 0x20) = 0;
  free(A->content);
  A->content = (void *)0x0;
  free(A->ops);
  A->ops = (_generic_SUNMatrix_Ops *)0x0;
  free(A);
  return;
}

Assistant:

void SUNMatDestroy_Dense(SUNMatrix A)
{
  /* perform operation */
  free(SM_DATA_D(A));  SM_DATA_D(A) = NULL;
  free(SM_CONTENT_D(A)->cols);  SM_CONTENT_D(A)->cols = NULL;
  free(A->content);  A->content = NULL;
  free(A->ops);  A->ops = NULL;
  free(A); A = NULL;
  return;
}